

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcp_event_handler.c
# Opt level: O0

pcp_flow_event_e fhndl_send_renew(pcp_flow_t *f,pcp_recv_msg_t *msg)

{
  pcp_errno pVar1;
  pcp_server_t *s_00;
  long lVar2;
  long timeout_add;
  pcp_server_t *s;
  pcp_recv_msg_t *msg_local;
  pcp_flow_t *f_local;
  
  s_00 = get_pcp_server(f->ctx,f->pcp_server_indx);
  if (s_00 == (pcp_server_t *)0x0) {
    f_local._4_4_ = fev_failed;
  }
  else {
    pVar1 = pcp_flow_send_msg(f,s_00);
    if (pVar1 == PCP_ERR_SUCCESS) {
      gettimeofday((timeval *)&f->timeout,(__timezone_ptr_t)0x0);
      lVar2 = f->recv_lifetime - (f->timeout).tv_sec >> 1;
      if (lVar2 == 0) {
        f_local._4_4_ = fev_failed;
      }
      else {
        (f->timeout).tv_sec = lVar2 + (f->timeout).tv_sec;
        f_local._4_4_ = fev_msg_sent;
      }
    }
    else {
      f_local._4_4_ = fev_failed;
    }
  }
  return f_local._4_4_;
}

Assistant:

static pcp_flow_event_e fhndl_send_renew(pcp_flow_t *f,
                                         UNUSED pcp_recv_msg_t *msg) {
    pcp_server_t *s = get_pcp_server(f->ctx, f->pcp_server_indx);
    long timeout_add;

    if (!s) {
        return fev_failed;
    }

    if (pcp_flow_send_msg(f, s) != PCP_ERR_SUCCESS) {
        return fev_failed;
    }

    gettimeofday(&f->timeout, NULL);
    timeout_add = (long)((f->recv_lifetime - f->timeout.tv_sec) >> 1);

    if (timeout_add == 0) {
        return fev_failed;
    } else {
        f->timeout.tv_sec += timeout_add;
    }

    return fev_msg_sent;
}